

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O1

int __thiscall QTemporaryDir::remove(QTemporaryDir *this,char *__filename)

{
  Data *pDVar1;
  char16_t *pcVar2;
  int *piVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined7 extraout_var;
  storage_type *psVar6;
  QTemporaryDirPrivate *pQVar7;
  int iVar8;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QString local_98;
  QArrayData *local_78;
  QChar *local_70;
  size_t local_68;
  QString local_60;
  char *local_48;
  undefined1 local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = this->d_ptr;
  if (pQVar7->success == true) {
    pDVar1 = (pQVar7->pathOrError).d.d;
    local_60.d.d._0_4_ = SUB84(pDVar1,0);
    local_60.d.d._4_4_ = (undefined4)((ulong)pDVar1 >> 0x20);
    pcVar2 = (pQVar7->pathOrError).d.ptr;
    local_60.d.ptr._0_4_ = SUB84(pcVar2,0);
    local_60.d.ptr._4_4_ = (undefined4)((ulong)pcVar2 >> 0x20);
    psVar6 = (storage_type *)(pQVar7->pathOrError).d.size;
    local_60.d.size._0_4_ = SUB84(psVar6,0);
    local_60.d.size._4_4_ = (undefined4)((ulong)psVar6 >> 0x20);
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type_conflict)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> +
           1);
      UNLOCK();
    }
    QDir::QDir((QDir *)(local_40 + 8),&local_60);
    bVar5 = QDir::removeRecursively((QDir *)(local_40 + 8));
    iVar8 = (int)CONCAT71(extraout_var,bVar5);
    QDir::~QDir((QDir *)(local_40 + 8));
    piVar3 = (int *)CONCAT44(local_60.d.d._4_4_,local_60.d.d._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_60.d.d._4_4_,local_60.d.d._0_4_),2,0x10)
        ;
      }
    }
    if (!bVar5) {
      local_60.d.d._0_4_ = 2;
      local_60.d.d._4_4_ = 0;
      local_60.d.ptr._0_4_ = 0;
      local_60.d.ptr._4_4_ = 0;
      local_60.d.size._0_4_ = 0;
      local_60.d.size._4_4_ = 0;
      local_48 = "default";
      QMessageLogger::warning((QMessageLogger *)local_40);
      uVar4 = local_40._0_8_;
      ba.m_data = psVar6;
      ba.m_size = (qsizetype)"QTemporaryDir: Unable to remove";
      QString::fromUtf8((QString *)(local_40 + 8),(QString *)0x1f,ba);
      ::QTextStream::operator<<((QTextStream *)uVar4,(QString *)(local_40 + 8));
      if ((QArrayData *)local_40._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_40._8_8_,2,0x10);
        }
      }
      if (*(bool *)(local_40._0_8_ + 0x30) == true) {
        ::QTextStream::operator<<((QTextStream *)local_40._0_8_,' ');
      }
      pQVar7 = this->d_ptr;
      if (pQVar7->success == true) {
        local_98.d.d = (pQVar7->pathOrError).d.d;
        local_98.d.ptr = (pQVar7->pathOrError).d.ptr;
        pQVar7 = (QTemporaryDirPrivate *)(pQVar7->pathOrError).d.size;
        local_98.d.size = (qsizetype)pQVar7;
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      else {
        local_98.d.d = (Data *)0x0;
        local_98.d.ptr = (char16_t *)0x0;
        local_98.d.size = 0;
      }
      QDir::toNativeSeparators(&local_98);
      if (local_70 == (QChar *)0x0) {
        local_70 = (QChar *)0x530c88;
      }
      QDebug::putString((QDebug *)local_40,local_70,local_68);
      if (*(bool *)(local_40._0_8_ + 0x30) == true) {
        ::QTextStream::operator<<((QTextStream *)local_40._0_8_,' ');
      }
      uVar4 = local_40._0_8_;
      ba_00.m_data = (storage_type *)pQVar7;
      ba_00.m_size = (qsizetype)"most likely due to the presence of read-only files.";
      QString::fromUtf8((QString *)(local_40 + 8),(QString *)0x33,ba_00);
      ::QTextStream::operator<<((QTextStream *)uVar4,(QString *)(local_40 + 8));
      if ((QArrayData *)local_40._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_40._8_8_,2,0x10);
        }
      }
      if (*(bool *)(local_40._0_8_ + 0x30) == true) {
        ::QTextStream::operator<<((QTextStream *)local_40._0_8_,' ');
      }
      if (local_78 != (QArrayData *)0x0) {
        LOCK();
        (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_78,2,0x10);
        }
      }
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      QDebug::~QDebug((QDebug *)local_40);
    }
  }
  else {
    iVar8 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool QTemporaryDir::remove()
{
    if (!d_ptr->success)
        return false;
    Q_ASSERT(!path().isEmpty());
    Q_ASSERT(path() != "."_L1);

    const bool result = QDir(path()).removeRecursively();
    if (!result) {
        qWarning() << "QTemporaryDir: Unable to remove"
                   << QDir::toNativeSeparators(path())
                   << "most likely due to the presence of read-only files.";
    }
    return result;
}